

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu_absolute_instructions.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_10a125::CpuAbsoluteTest::run_write_instruction
          (CpuAbsoluteTest *this,uint8_t instruction)

{
  NiceMock<n_e_s::core::test::MockMmu> *this_00;
  CpuRegisters *pCVar1;
  uchar uVar2;
  uint16_t uVar3;
  undefined2 uVar4;
  TypedExpectation<unsigned_char_(unsigned_short)> *pTVar5;
  ActionInterface<unsigned_char_(unsigned_short)> *pAVar6;
  pointer *__ptr;
  char cVar7;
  _func_int *message;
  AssertionResult gtest_ar;
  _Any_data local_a8;
  code *local_98;
  MatcherBase<unsigned_char> local_88;
  uchar *local_70;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_68;
  undefined1 local_60 [8];
  MatcherBase<unsigned_char> local_58;
  MatcherBase<unsigned_short> local_40;
  
  uVar3 = *(uint16_t *)&(this->super_CpuTest).field_0x112;
  (this->super_CpuTest).expected.pc = uVar3;
  (this->super_CpuTest).registers.pc = uVar3;
  n_e_s::core::test::CpuTest::stage_instruction(&this->super_CpuTest,instruction);
  pCVar1 = &(this->super_CpuTest).expected;
  pCVar1->pc = pCVar1->pc + 2;
  uVar4 = *(undefined2 *)&(this->super_CpuTest).field_0x116;
  this_00 = &(this->super_CpuTest).mmu;
  testing::Matcher<unsigned_short>::Matcher
            ((Matcher<unsigned_short> *)&local_88,*(short *)&(this->super_CpuTest).field_0x112 + 1);
  n_e_s::core::test::MockMmu::gmock_read_byte
            ((MockSpec<unsigned_char_(unsigned_short)> *)local_60,&this_00->super_MockMmu,
             (Matcher<unsigned_short> *)&local_88);
  testing::internal::GetWithoutMatchers();
  pTVar5 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
                     ((MockSpec<unsigned_char_(unsigned_short)> *)local_60,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/test/src/test_cpu_absolute_instructions.cpp"
                      ,0x2e,"mmu","read_byte(start_pc + 1)");
  local_70 = (uchar *)operator_new(1);
  *local_70 = (uchar)uVar4;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<unsigned_char*>
            (&local_68,local_70);
  pAVar6 = (ActionInterface<unsigned_char_(unsigned_short)> *)operator_new(0x10);
  pAVar6->_vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_002a11a0;
  uVar2 = *local_70;
  *(uchar *)&pAVar6[1]._vptr_ActionInterface = uVar2;
  *(uchar *)((long)&pAVar6[1]._vptr_ActionInterface + 1) = uVar2;
  testing::Action<unsigned_char_(unsigned_short)>::Action
            ((Action<unsigned_char_(unsigned_short)> *)&local_a8,pAVar6);
  testing::internal::TypedExpectation<unsigned_char_(unsigned_short)>::WillOnce
            (pTVar5,(Action<unsigned_char_(unsigned_short)> *)&local_a8);
  if (local_98 != (code *)0x0) {
    (*local_98)(&local_a8,&local_a8,3);
  }
  if (local_68._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68._M_pi);
  }
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase
            ((MatcherBase<unsigned_short> *)
             &((MockSpec<void_(unsigned_short,_unsigned_char)> *)local_60)->matchers_);
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase
            ((MatcherBase<unsigned_short> *)&local_88);
  testing::Matcher<unsigned_short>::Matcher
            ((Matcher<unsigned_short> *)&local_88,*(short *)&(this->super_CpuTest).field_0x112 + 2);
  n_e_s::core::test::MockMmu::gmock_read_byte
            ((MockSpec<unsigned_char_(unsigned_short)> *)local_60,&this_00->super_MockMmu,
             (Matcher<unsigned_short> *)&local_88);
  testing::internal::GetWithoutMatchers();
  pTVar5 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
                     ((MockSpec<unsigned_char_(unsigned_short)> *)local_60,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/test/src/test_cpu_absolute_instructions.cpp"
                      ,0x30,"mmu","read_byte(start_pc + 2)");
  local_70 = (uchar *)operator_new(1);
  *local_70 = (uchar)((ushort)uVar4 >> 8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<unsigned_char*>
            (&local_68,local_70);
  pAVar6 = (ActionInterface<unsigned_char_(unsigned_short)> *)operator_new(0x10);
  pAVar6->_vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_002a11a0;
  uVar2 = *local_70;
  *(uchar *)&pAVar6[1]._vptr_ActionInterface = uVar2;
  *(uchar *)((long)&pAVar6[1]._vptr_ActionInterface + 1) = uVar2;
  testing::Action<unsigned_char_(unsigned_short)>::Action
            ((Action<unsigned_char_(unsigned_short)> *)&local_a8,pAVar6);
  testing::internal::TypedExpectation<unsigned_char_(unsigned_short)>::WillOnce
            (pTVar5,(Action<unsigned_char_(unsigned_short)> *)&local_a8);
  if (local_98 != (code *)0x0) {
    (*local_98)(&local_a8,&local_a8,3);
  }
  if (local_68._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68._M_pi);
  }
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase
            ((MatcherBase<unsigned_short> *)
             &((MockSpec<void_(unsigned_short,_unsigned_char)> *)local_60)->matchers_);
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase
            ((MatcherBase<unsigned_short> *)&local_88);
  testing::Matcher<unsigned_short>::Matcher
            ((Matcher<unsigned_short> *)&local_a8,
             *(unsigned_short *)&(this->super_CpuTest).field_0x116);
  testing::Matcher<unsigned_char>::Matcher
            ((Matcher<unsigned_char> *)&local_88,(this->super_CpuTest).field_0x114);
  n_e_s::core::test::MockMmu::gmock_write_byte
            ((MockSpec<void_(unsigned_short,_unsigned_char)> *)local_60,&this_00->super_MockMmu,
             (Matcher<unsigned_short> *)&local_a8,(Matcher<unsigned_char> *)&local_88);
  testing::internal::GetWithoutMatchers();
  testing::internal::MockSpec<void_(unsigned_short,_unsigned_char)>::InternalExpectedAt
            ((MockSpec<void_(unsigned_short,_unsigned_char)> *)local_60,
             "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/test/src/test_cpu_absolute_instructions.cpp"
             ,0x32,"mmu","write_byte(effective_address, memory_content)");
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase
            ((MatcherBase<unsigned_short> *)
             &(((MockSpec<void_(unsigned_short,_unsigned_char)> *)local_60)->matchers_).
              super__Tuple_impl<0UL,_testing::Matcher<unsigned_short>,_testing::Matcher<unsigned_char>_>
              .super__Head_base<0UL,_testing::Matcher<unsigned_short>,_false>);
  testing::internal::MatcherBase<unsigned_char>::~MatcherBase
            ((MatcherBase<unsigned_char> *)
             &((MockSpec<void_(unsigned_short,_unsigned_char)> *)local_60)->matchers_);
  testing::internal::MatcherBase<unsigned_char>::~MatcherBase(&local_88);
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase
            ((MatcherBase<unsigned_short> *)&local_a8);
  cVar7 = '\x04';
  do {
    (*(((this->super_CpuTest).cpu._M_t.
        super___uniq_ptr_impl<n_e_s::core::IMos6502,_std::default_delete<n_e_s::core::IMos6502>_>.
        _M_t.
        super__Tuple_impl<0UL,_n_e_s::core::IMos6502_*,_std::default_delete<n_e_s::core::IMos6502>_>
        .super__Head_base<0UL,_n_e_s::core::IMos6502_*,_false>._M_head_impl)->super_ICpu)._vptr_ICpu
      [2])();
    cVar7 = cVar7 + -1;
  } while (cVar7 != '\0');
  testing::internal::CmpHelperEQ<n_e_s::core::CpuRegisters,n_e_s::core::CpuRegisters>
            ((internal *)local_60,"expected","registers",&(this->super_CpuTest).expected,
             &(this->super_CpuTest).registers);
  if (local_60[0] == '\0') {
    testing::Message::Message((Message *)&local_a8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        local_58.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = (_func_int *)0x247c3a;
    }
    else {
      message = *local_58.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/test/src/test_cpu_absolute_instructions.cpp"
               ,0x35,(char *)message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_88,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_88);
    if ((long *)local_a8._M_unused._0_8_ != (long *)0x0) {
      (**(code **)(*local_a8._M_unused._M_object + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      local_58.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&((MockSpec<void_(unsigned_short,_unsigned_char)> *)local_60)->matchers_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_58.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface);
  }
  return;
}

Assistant:

void run_write_instruction(uint8_t instruction) {
        registers.pc = expected.pc = start_pc;
        stage_instruction(instruction);
        expected.pc += 2;

        const auto lower_address = static_cast<uint8_t>(
                effective_address & static_cast<uint16_t>(0x00FFu));
        const auto upper_address =
                static_cast<uint8_t>((effective_address & 0xFF00u) >> 8u);

        EXPECT_CALL(mmu, read_byte(start_pc + 1))
                .WillOnce(Return(lower_address));
        EXPECT_CALL(mmu, read_byte(start_pc + 2))
                .WillOnce(Return(upper_address));
        EXPECT_CALL(mmu, write_byte(effective_address, memory_content));

        step_execution(4);
        EXPECT_EQ(expected, registers);
    }